

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

uint64_t __thiscall
kj::anon_unknown_77::AsyncTee::Buffer::consume
          (Buffer *this,ArrayPtr<unsigned_char> *readBuffer,size_t *minBytes)

{
  Array<unsigned_char> *this_00;
  ArrayPtr<unsigned_char> content;
  size_t sVar1;
  uchar *unaff_RBX;
  uint64_t uVar2;
  ulong __n;
  size_t unaff_R12;
  Array<unsigned_char> AStackY_48;
  
  uVar2 = 0;
  while( true ) {
    __n = readBuffer->size_;
    if (__n == 0) {
      return uVar2;
    }
    this_00 = (this->bufferList).
              super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->bufferList).
        super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur == this_00) break;
    if (this_00->size_ < __n) {
      __n = this_00->size_;
    }
    memcpy(readBuffer->ptr,this_00->ptr,__n);
    uVar2 = uVar2 + __n;
    readBuffer->ptr = readBuffer->ptr + __n;
    readBuffer->size_ = readBuffer->size_ - __n;
    sVar1 = 0;
    if (__n <= *minBytes) {
      sVar1 = *minBytes - __n;
    }
    *minBytes = sVar1;
    if (this_00->size_ != __n) {
      content.size_ = unaff_R12;
      content.ptr = unaff_RBX;
      heapArray<unsigned_char>(content);
      Array<unsigned_char>::operator=(this_00,&AStackY_48);
      Array<unsigned_char>::~Array(&AStackY_48);
      return uVar2;
    }
    std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::pop_front
              (&this->bufferList);
  }
  return uVar2;
}

Assistant:

uint64_t AsyncTee::Buffer::consume(ArrayPtr<byte>& readBuffer, size_t& minBytes) {
  uint64_t totalAmount = 0;

  while (readBuffer.size() > 0 && !bufferList.empty()) {
    auto& bytes = bufferList.front();
    auto amount = kj::min(bytes.size(), readBuffer.size());
    memcpy(readBuffer.begin(), bytes.begin(), amount);
    totalAmount += amount;

    readBuffer = readBuffer.slice(amount, readBuffer.size());
    minBytes -= kj::min(amount, minBytes);

    if (amount == bytes.size()) {
      bufferList.pop_front();
    } else {
      bytes = heapArray(bytes.slice(amount, bytes.size()));
      return totalAmount;
    }
  }

  return totalAmount;
}